

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkUniversal::Initialize
          (ChLinkUniversal *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2
          ,bool local,ChFrame<double> *frame1,ChFrame<double> *frame2)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar7;
  ChBodyFrame *pCVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChFrame<double> frame2_abs;
  ChFrame<double> frame1_abs;
  ChFrame<double> local_1e0;
  undefined1 local_158 [56];
  double local_120;
  double local_118;
  undefined1 local_d0 [24];
  double local_b8;
  double local_90;
  double local_78;
  double local_60;
  ChVector<double> local_48;
  
  peVar2 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar8 = &peVar2->super_ChBodyFrame;
  if (peVar2 == (element_type *)0x0) {
    pCVar8 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar8;
  peVar2 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar7 = &peVar2->super_ChBodyFrame;
  if (peVar2 == (element_type *)0x0) {
    pCVar7 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar7;
  iVar5 = (*(pCVar8->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar6 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_x,(ChVariables *)CONCAT44(extraout_var,iVar5),
             (ChVariables *)CONCAT44(extraout_var_00,iVar6));
  iVar5 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar6 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_y,(ChVariables *)CONCAT44(extraout_var_01,iVar5),
             (ChVariables *)CONCAT44(extraout_var_02,iVar6));
  iVar5 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar6 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_z,(ChVariables *)CONCAT44(extraout_var_03,iVar5),
             (ChVariables *)CONCAT44(extraout_var_04,iVar6));
  iVar5 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar6 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_05,iVar5),
             (ChVariables *)CONCAT44(extraout_var_06,iVar6));
  local_1e0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_158._16_8_ = 0.0;
  local_1e0.coord.pos.m_data[2] = 0.0;
  local_158._0_8_ = (_func_int **)0x0;
  local_158._8_8_ = 0.0;
  local_1e0.coord.pos.m_data[0] = 0.0;
  local_1e0.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)local_d0,(ChVector<double> *)local_158,
             (ChQuaternion<double> *)&local_1e0);
  local_158._0_8_ = &DAT_3ff0000000000000;
  local_158._24_8_ = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_158._8_8_ = 0.0;
  local_158._16_8_ = 0.0;
  ChFrame<double>::ChFrame(&local_1e0,&local_48,(ChQuaternion<double> *)local_158);
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    ChFrame<double>::TransformParentToLocal
              ((ChFrame<double> *)(this->super_ChLink).Body1,frame1,&this->m_frame1);
    ChFrame<double>::TransformParentToLocal
              ((ChFrame<double> *)(this->super_ChLink).Body2,frame2,&this->m_frame2);
    ChFrame<double>::operator=((ChFrame<double> *)local_d0,frame1);
    ChFrame<double>::operator=(&local_1e0,frame2);
  }
  else {
    ChFrame<double>::operator=(&this->m_frame1,frame1);
    ChFrame<double>::operator=(&this->m_frame2,frame2);
    ChFrame<double>::operator>>
              ((ChFrame<double> *)local_158,frame1,(ChFrame<double> *)(this->super_ChLink).Body1);
    ChFrame<double>::operator=((ChFrame<double> *)local_d0,(ChFrame<double> *)local_158);
    ChFrame<double>::operator>>
              ((ChFrame<double> *)local_158,frame2,(ChFrame<double> *)(this->super_ChLink).Body2);
    ChFrame<double>::operator=(&local_1e0,(ChFrame<double> *)local_158);
  }
  local_158._24_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_120 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_120;
  local_158._16_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_158._16_8_;
  local_158._0_8_ = (_func_int **)0x0;
  auVar16._0_8_ = -(double)local_158._24_8_;
  auVar16._8_4_ = 0;
  auVar16._12_4_ = 0x80000000;
  local_158._8_8_ = vmovlps_avx(auVar16);
  auVar3 = vmovlhps_avx(auVar9,auVar12);
  local_158._32_8_ = 0.0;
  local_158._40_8_ = auVar3._0_8_ ^ 0x8000000000000000;
  local_158._48_4_ = auVar3._8_4_;
  local_158._52_4_ = auVar3._12_4_ ^ 0x80000000;
  local_118 = 0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->m_u1_tilde).super_Matrix<double,_3,_3,_1,_3,_3>,
             (Matrix<double,_3,_3,_1,_3,_3> *)local_158);
  local_158._24_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_120 = (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
  ;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_120;
  local_158._16_8_ =
       (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_158._16_8_;
  local_158._0_8_ = (_func_int **)0x0;
  auVar17._0_8_ = -(double)local_158._24_8_;
  auVar17._8_4_ = 0;
  auVar17._12_4_ = 0x80000000;
  local_158._8_8_ = vmovlps_avx(auVar17);
  auVar3 = vmovlhps_avx(auVar10,auVar13);
  local_158._32_8_ = 0.0;
  local_158._40_8_ = auVar3._0_8_ ^ 0x8000000000000000;
  local_158._48_4_ = auVar3._8_4_;
  local_158._52_4_ = auVar3._12_4_ ^ 0x80000000;
  local_118 = 0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
            (&(this->m_v2_tilde).super_Matrix<double,_3,_3,_1,_3,_3>,
             (Matrix<double,_3,_3,_1,_3,_3> *)local_158);
  auVar4._8_8_ = local_1e0.coord.pos.m_data[1];
  auVar4._0_8_ = local_1e0.coord.pos.m_data[0];
  auVar3 = vsubpd_avx(auVar4,local_d0._8_16_);
  *(undefined1 (*) [16])
   (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
       auVar3;
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]
       = local_1e0.coord.pos.m_data[2] - local_b8;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_90;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_60;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_78 *
       local_1e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar3 = vfmadd231sd_fma(auVar14,auVar11,auVar3);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_1e0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar3 = vfmadd231sd_fma(auVar3,auVar15,auVar1);
  (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = auVar3._0_8_;
  return;
}

Assistant:

void ChLinkUniversal::Initialize(std::shared_ptr<ChBody> body1,
                                 std::shared_ptr<ChBody> body2,
                                 bool local,
                                 const ChFrame<>& frame1,
                                 const ChFrame<>& frame2) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_x.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_y.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_z.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChFrame<> frame1_abs;
    ChFrame<> frame2_abs;

    if (local) {
        m_frame1 = frame1;
        m_frame2 = frame2;
        frame1_abs = frame1 >> *Body1;
        frame2_abs = frame2 >> *Body2;
    } else {
        ((ChFrame<>*)Body1)->TransformParentToLocal(frame1, m_frame1);
        ((ChFrame<>*)Body2)->TransformParentToLocal(frame2, m_frame2);
        frame1_abs = frame1;
        frame2_abs = frame2;
    }

    m_u1_tilde = ChStarMatrix33<>(m_frame1.GetA().Get_A_Xaxis());
    m_v2_tilde = ChStarMatrix33<>(m_frame2.GetA().Get_A_Yaxis());

    m_C(0) = frame2_abs.coord.pos.x() - frame1_abs.coord.pos.x();
    m_C(1) = frame2_abs.coord.pos.y() - frame1_abs.coord.pos.y();
    m_C(2) = frame2_abs.coord.pos.z() - frame1_abs.coord.pos.z();
    m_C(3) = Vdot(frame1_abs.GetA().Get_A_Xaxis(), frame2_abs.GetA().Get_A_Yaxis());
}